

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb_thrdpool.c
# Opt level: O3

void * uo_cb_execute(void *thrd_i)

{
  atomic_bool aVar1;
  uo_cb *cb;
  
  uo_cb_thrd_init();
  if (is_quitting == '\0') {
    do {
      cb = uo_cb_queue_try_dequeue();
      if (cb != (uo_cb *)0x0) {
        LOCK();
        thrdpool.executing_count = thrdpool.executing_count + 1;
        UNLOCK();
        uo_cb_invoke(cb);
        aVar1 = thrdpool.is_paused;
        LOCK();
        thrdpool.executing_count = thrdpool.executing_count - 1;
        UNLOCK();
        LOCK();
        thrdpool.sample.completions = thrdpool.sample.completions + 1;
        UNLOCK();
        LOCK();
        thrdpool.is_paused = false;
        UNLOCK();
        if ((aVar1 & 1U) != 0) {
          sem_post((sem_t *)&thrdpool.update_sem);
        }
      }
      if (thrdpool.thrd_count_target < thrdpool.thrd_count) {
        thrdpool.thrd_count = thrdpool.thrd_count - 1;
        LOCK();
        UNLOCK();
        break;
      }
    } while (is_quitting != '\x01');
  }
  uo_cb_thrd_quit();
  thrdpool.cb_thrds[(long)thrd_i].state = UO_CB_THRD_EXITED;
  return &thrdpool;
}

Assistant:

static void *uo_cb_execute(
    void *thrd_i)
{
    uo_cb_thrd_init();

    while (!is_quitting)
    {
        uo_cb *cb = uo_cb_queue_try_dequeue();

        if (cb)
        {
            uo_cb_thrdpool_notify_before_invoke();
            uo_cb_invoke(cb);
            uo_cb_thrdpool_notify_after_invoke();
        }

        size_t count = atomic_load(&thrdpool.thrd_count);
        size_t count_target = thrdpool.thrd_count_target;

        if (count > count_target && atomic_compare_exchange_strong(&thrdpool.thrd_count, &count, count - 1))
            break;
    }

    uo_cb_thrd_quit();

    thrdpool.cb_thrds[(size_t)thrd_i].state = UO_CB_THRD_EXITED;
}